

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

void __thiscall cfd::core::Serializer::AddDirectBigEndianNumber(Serializer *this,uint32_t number)

{
  CheckNeedSize(this,4);
  if (IsBigEndian()::is_big_endian == (undefined1 *)0x0) {
    IsBigEndian()::is_big_endian = &IsBigEndian()::kFalse;
  }
  if (IsBigEndian()::kFalse != '\x01') {
    number = number >> 0x18 | (number & 0xff0000) >> 8 | (number & 0xff00) << 8 | number << 0x18;
  }
  *(uint32_t *)
   ((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + this->offset_) = number;
  this->offset_ = this->offset_ + 4;
  return;
}

Assistant:

void Serializer::AddDirectBigEndianNumber(uint32_t number) {
  CheckNeedSize(sizeof(number));
  uint8_t* buf = &buffer_.data()[offset_];
  if (IsBigEndian()) {
    memcpy(buf, &number, sizeof(number));
  } else {
    uint8_t tmp_buf[4] = {
        static_cast<uint8_t>((number & 0xff000000) >> 24),
        static_cast<uint8_t>((number & 0x00ff0000) >> 16),
        static_cast<uint8_t>((number & 0x0000ff00) >> 8),
        static_cast<uint8_t>(number & 0x000000ff),
    };
    memcpy(buf, tmp_buf, sizeof(tmp_buf));
  }
  offset_ += sizeof(number);
}